

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteSwapper.h
# Opt level: O0

void __thiscall
Assimp::Intern::Getter<true,_double,_true>::operator()
          (Getter<true,_double,_true> *this,double *inout,bool le)

{
  ByteSwapper<double,_false> local_1b;
  ByteSwapper<double,_true> local_1a;
  byte local_19;
  double *pdStack_18;
  bool le_local;
  double *inout_local;
  Getter<true,_double,_true> *this_local;
  
  local_19 = (le ^ 0xffU) & 1;
  pdStack_18 = inout;
  inout_local = (double *)this;
  if (local_19 == 0) {
    ByteSwapper<double,_false>::operator()(&local_1b,inout);
  }
  else {
    ByteSwapper<double,_true>::operator()(&local_1a,inout);
  }
  return;
}

Assistant:

void operator() (T* inout, bool le) {
#ifdef AI_BUILD_BIG_ENDIAN
        le =  le;
#else
        le =  !le;
#endif
        if (le) {
            ByteSwapper<T,(sizeof(T)>1?true:false)> () (inout);
        }
        else ByteSwapper<T,false> () (inout);
    }